

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O0

void soplex::updateScaleFinal<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double q,double eprev1,double eprev2,double epsilon)

{
  bool bVar1;
  SSVectorBase<double> *in_RCX;
  SSVectorBase<double> *in_RDX;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  undefined8 *in_R8;
  SSVectorBase<double> *in_XMM2_Qa;
  SSVectorBase<double> *in_XMM3_Qa;
  double fac;
  double in_stack_ffffffffffffff98;
  
  SSVectorBase<double>::operator-=(in_RSI,in_RDX);
  bVar1 = isZero<double,double>((double)in_RDI,in_stack_ffffffffffffff98);
  if (bVar1) {
    SSVectorBase<double>::clear(in_RDI);
  }
  else {
    SSVectorBase<double>::operator*=(in_XMM2_Qa,(double)in_XMM3_Qa);
  }
  SSVectorBase<double>::assignPWproduct4setup<double,double>(in_RSI,in_RDX,in_RCX);
  SSVectorBase<double>::operator+=(in_XMM2_Qa,in_XMM3_Qa);
  SSVectorBase<double>::operator*=(in_XMM2_Qa,(double)in_XMM3_Qa);
  SSVectorBase<double>::operator+=(in_XMM2_Qa,in_XMM3_Qa);
  (in_RCX->super_IdxSet)._vptr_IdxSet = (_func_int **)*in_R8;
  return;
}

Assistant:

static void updateScaleFinal(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R q,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(q != 0);
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);

   R fac = -(eprev1 * eprev2);

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);
   *pscprev *= 1.0 / q;
   *pscprev += *psccurr;

   psccurr = pscprev;
}